

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O0

void __thiscall mat_lib::vector<double>::vector(vector<double> *this,string *file_name)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *__s;
  logic_error *plVar5;
  size_type sVar6;
  reference __str;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  double local_4d8;
  ulong local_4d0;
  size_t i;
  string_type local_4b0;
  undefined1 local_490 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  numbers;
  undefined1 local_458 [8];
  cmatch results;
  regex rx;
  undefined1 local_410 [12];
  undefined1 local_400 [12];
  string local_3f0 [8];
  string str;
  string local_3c8 [32];
  ostringstream local_3a8 [8];
  ostringstream str_stream;
  long local_220;
  ifstream ifs;
  string *file_name_local;
  vector<double> *this_local;
  
  std::vector<double,_std::allocator<double>_>::vector(&this->container__);
  this->format__ = fixed;
  this->fractional_digits__ = 6;
  std::ifstream::ifstream(&local_220,file_name,8);
  bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar1 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_3a8);
    poVar4 = std::operator<<((ostream *)local_3a8,"cannot open file \"");
    poVar4 = std::operator<<(poVar4,(string *)file_name);
    poVar4 = std::operator<<(poVar4,"\"! (");
    poVar4 = std::operator<<(poVar4,"vector");
    poVar4 = std::operator<<(poVar4,"() in ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/miguel-kjh[P]MatLibraryPy/matrix.hpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x3a6);
    std::operator<<(poVar4,")");
    str.field_2._M_local_buf[0xf] = '\x01';
    plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::logic_error::logic_error(plVar5,local_3c8);
    str.field_2._M_local_buf[0xf] = '\0';
    __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_400,
             (istream_type *)&local_220);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_410);
  std::allocator<char>::allocator();
  __beg._12_4_ = 0;
  __beg._M_sbuf = (streambuf_type *)local_400._0_8_;
  __beg._M_c = local_400._8_4_;
  __end._12_4_ = 0;
  __end._M_sbuf = (streambuf_type *)local_410._0_8_;
  __end._M_c = local_410._8_4_;
  std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            (local_3f0,__beg,__end,
             (allocator<char> *)
             ((long)&rx._M_automaton.
                     super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&rx._M_automaton.
                     super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&results._M_begin,
             "mat_lib::vector\\[(\\d)\\]\\{(([-+]?\\d*\\.?\\d+([eE][-+]?\\d+)?(,\\s|\\n\\s*)?)+)+\\}"
             ,0x10);
  std::__cxx11::match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ::match_results((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   *)local_458);
  __s = (char *)std::__cxx11::string::c_str();
  bVar2 = std::
          regex_match<char,std::allocator<std::__cxx11::sub_match<char_const*>>,std::__cxx11::regex_traits<char>>
                    (__s,(match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          *)local_458,
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&results._M_begin,0);
  if (!bVar2) {
    plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar5,"the file are incorrect: bad expresion");
    __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  std::__cxx11::match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ::str((string_type *)
        &numbers.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage,
        (match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> *)
        local_458,1);
  iVar3 = std::__cxx11::stoi((string *)
                             &numbers.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_t *)0x0,10);
  this->max_size__ = (long)iVar3;
  std::__cxx11::string::~string
            ((string *)
             &numbers.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_490);
  std::__cxx11::match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ::str(&local_4b0,
        (match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> *)
        local_458,2);
  boost::algorithm::is_any_of<char[6]>((is_any_ofF<char> *)&i,(char (*) [6])"(,|\n)");
  boost::algorithm::
  split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string,boost::algorithm::detail::is_any_ofF<char>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_490,&local_4b0,(is_any_ofF<char> *)&i,token_compress_off);
  boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF((is_any_ofF<char> *)&i);
  std::__cxx11::string::~string((string *)&local_4b0);
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_490);
  if (sVar6 != this->max_size__) {
    plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar5,"the file are incorrect: bad declaration of matrix");
    __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  for (local_4d0 = 0; local_4d0 < this->max_size__; local_4d0 = local_4d0 + 1) {
    __str = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_490,local_4d0);
    local_4d8 = std::__cxx11::stod(__str,(size_t *)0x0);
    std::vector<double,_std::allocator<double>_>::push_back(&this->container__,&local_4d8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_490);
  std::__cxx11::match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ::~match_results((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    *)local_458);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&results._M_begin);
  std::__cxx11::string::~string(local_3f0);
  std::ifstream::~ifstream(&local_220);
  return;
}

Assistant:

vector<T>::vector(const string &file_name) {
        ifstream ifs(file_name);
        if(!ifs)
        {
            ostringstream str_stream;
            str_stream<<"cannot open file \""<<file_name<<"\"! ("
                      <<__func__<<"() in "<<__FILE__<<":"<<__LINE__<<")";
            throw logic_error(str_stream.str());
        }

        string str((istreambuf_iterator<char>(ifs)),
                   istreambuf_iterator<char>());

        regex rx(R"(mat_lib::vector\[(\d)\]\{(([-+]?\d*\.?\d+([eE][-+]?\d+)?(,\s|\n\s*)?)+)+\})");
        cmatch results;
        if (not regex_match(str.c_str(),results,rx)) {
            throw logic_error("the file are incorrect: bad expresion");
        }

        max_size__ = stoi(results.str(1));
        std::vector<string> numbers;
        boost::split(numbers, results.str(2), boost::is_any_of("(,|\n)"));


        if (numbers.size() != max_size__) {
            throw logic_error("the file are incorrect: bad declaration of matrix");
        }

        for(size_t i=0; i<max_size__; i++) {
            container__.push_back(stod(numbers[i]));
        }

    }